

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O3

Vec_Int_t * Aig_ManPartitionLevelized(Aig_Man_t *p,int nPartSize)

{
  int iVar1;
  int iVar2;
  void **ppvVar3;
  void *pvVar4;
  bool bVar5;
  int iVar6;
  Vec_Vec_t *__ptr;
  Vec_Int_t *pVVar7;
  int *__s;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  
  __ptr = Aig_ManLevelize(p);
  iVar1 = p->vObjs->nSize;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar8 = iVar1;
  }
  pVVar7->nCap = iVar8;
  if (iVar8 == 0) {
    pVVar7->pArray = (int *)0x0;
    pVVar7->nSize = iVar1;
  }
  else {
    __s = (int *)malloc((long)iVar8 << 2);
    pVVar7->pArray = __s;
    pVVar7->nSize = iVar1;
    if (__s != (int *)0x0) {
      memset(__s,0,(long)iVar1 << 2);
      goto LAB_0069b558;
    }
  }
  __s = (int *)0x0;
LAB_0069b558:
  iVar8 = __ptr->nSize;
  uVar10 = (ulong)iVar8;
  if (0 < (long)uVar10) {
    ppvVar3 = __ptr->pArray;
    iVar9 = 0;
    uVar11 = uVar10;
    do {
      if (uVar10 < uVar11) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecVec.h"
                      ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
      }
      pvVar4 = ppvVar3[uVar11 - 1];
      lVar12 = (long)*(int *)((long)pvVar4 + 4);
      iVar13 = iVar9;
      if (0 < lVar12) {
        iVar13 = iVar9 + *(int *)((long)pvVar4 + 4);
        do {
          if (*(int *)((long)pvVar4 + 4) < lVar12) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          iVar2 = *(int *)(*(long *)(*(long *)((long)pvVar4 + 8) + -8 + lVar12 * 8) + 0x24);
          if (((long)iVar2 < 0) || (iVar1 <= iVar2)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          iVar6 = iVar9 / nPartSize;
          iVar9 = iVar9 + 1;
          __s[iVar2] = iVar6;
          lVar12 = lVar12 + -1;
        } while ((int)lVar12 != 0);
      }
      iVar9 = iVar13;
      bVar5 = 1 < (long)uVar11;
      uVar11 = uVar11 - 1;
    } while (bVar5);
    if (0 < iVar8) {
      lVar12 = 0;
      do {
        pvVar4 = __ptr->pArray[lVar12];
        if (pvVar4 != (void *)0x0) {
          if (*(void **)((long)pvVar4 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar4 + 8));
          }
          free(pvVar4);
          uVar10 = (ulong)(uint)__ptr->nSize;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < (int)uVar10);
    }
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  return pVVar7;
}

Assistant:

Vec_Int_t * Aig_ManPartitionLevelized( Aig_Man_t * p, int nPartSize )
{
    Vec_Int_t * vId2Part;
    Vec_Vec_t * vNodes;
    Aig_Obj_t * pObj;
    int i, k, Counter = 0;
    vNodes = Aig_ManLevelize( p );
    vId2Part = Vec_IntStart( Aig_ManObjNumMax(p) );
    Vec_VecForEachEntryReverseReverse( Aig_Obj_t *, vNodes, pObj, i, k )
        Vec_IntWriteEntry( vId2Part, Aig_ObjId(pObj), Counter++/nPartSize );
    Vec_VecFree( vNodes );
    return vId2Part;
}